

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac.c
# Opt level: O2

int tc_hmac_init(TCHmacState_t ctx)

{
  if (ctx != (TCHmacState_t)0x0) {
    tc_sha256_init(&ctx->hash_state);
    tc_sha256_update(&ctx->hash_state,ctx->key,0x40);
    return 1;
  }
  return 0;
}

Assistant:

int tc_hmac_init(TCHmacState_t ctx)
{

	/* input sanity check: */
	if (ctx == (TCHmacState_t) 0) {
		return TC_CRYPTO_FAIL;
	}

  (void) tc_sha256_init(&ctx->hash_state);
  (void) tc_sha256_update(&ctx->hash_state, ctx->key, TC_SHA256_BLOCK_SIZE);

	return TC_CRYPTO_SUCCESS;
}